

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O3

REF_STATUS ref_meshlink_link(REF_GRID ref_grid,char *block_name)

{
  if (block_name != (char *)0x0) {
    printf("extracting mesh_model %s\n");
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_link(REF_GRID ref_grid,
                                     const char *block_name) {
  if (NULL == block_name) return REF_SUCCESS;
  printf("extracting mesh_model %s\n", block_name);
#ifdef HAVE_MESHLINK
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  MeshAssociativityObj mesh_assoc = (MeshAssociativityObj)(ref_geom->meshlink);
  MeshModelObj mesh_model;
  MLINT nsheet, msheet;
  REF_INT isheet;
  MeshSheetObj *sheet;
  MLINT nface, mface;
  MeshTopoObj *face;
  REF_INT iface;
  MLINT f2n[4], fn;
  MLINT sheet_gref;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  ParamVertexConstObj vert[3];
  MLINT nvert, vert_gref, mid;
  MLVector2D uv;
  REF_INT i, geom;
  REF_DBL param[2];
  char vref[REF_MESHLINK_MAX_STRING_SIZE];

  MLINT nstring, mstring;
  MeshTopoObj *string;
  REF_INT istring;
  MLINT string_gref;
  MLINT nedge, medge;
  MeshTopoObj *edge;
  REF_INT iedge;
  MLINT e2n[2], en;

  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT location, min_id, max_id;

  REF_BOOL verbose = REF_FALSE;

  RSS(ref_dict_create(&ref_dict), "create");
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_store(ref_dict, nodes[ref_cell_node_per(ref_cell)], REF_EMPTY),
        "store");
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dict_location(ref_dict, nodes[ref_cell_node_per(ref_cell)],
                          &location),
        "location");
    ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), cell) = -1 - location;
  }
  RSS(ref_dict_free(ref_dict), "free");

  REIS(0, ML_getMeshModelByName(mesh_assoc, block_name, &mesh_model),
       "Error creating Mesh Model Object");

  nsheet = ML_getNumMeshSheets(mesh_model);
  printf("nsheet %" MLINT_FORMAT "\n", nsheet);
  ref_malloc(sheet, nsheet, MeshSheetObj);
  REIS(0, ML_getMeshSheets(mesh_model, sheet, nsheet, &msheet),
       "Error getting array of Mesh Sheets");
  REIS(nsheet, msheet, "sheet miscount");

  for (isheet = 0; isheet < nsheet; isheet++) {
    REIS(0, ML_getMeshTopoGref(sheet[isheet], &sheet_gref),
         "Error getting Mesh Sheet gref");
    nface = ML_getNumSheetMeshFaces(sheet[isheet]);
    if (verbose)
      printf("nface %" MLINT_FORMAT " for sheet %d with gref %" MLINT_FORMAT
             "\n",
             nface, isheet, sheet_gref);
    ref_malloc(face, nface, MeshTopoObj);
    REIS(0, ML_getSheetMeshFaces(sheet[isheet], face, nface, &mface),
         "Error getting array of Mesh Sheet Mesh Faces");
    REIS(nface, mface, "face miscount");
    for (iface = 0; iface < nface; iface++) {
      REIS(0, ML_getFaceInds(face[iface], f2n, &fn), "Error Mesh Face Ind");
      REIS(3, fn, "face ind miscount");
      RSS(ref_node_local(ref_node, f2n[0] - 1, &(nodes[0])), "g2l");
      RSS(ref_node_local(ref_node, f2n[1] - 1, &(nodes[1])), "g2l");
      RSS(ref_node_local(ref_node, f2n[2] - 1, &(nodes[2])), "g2l");
      nodes[3] = (REF_INT)sheet_gref;
      RSS(ref_cell_with(ref_grid_tri(ref_grid), nodes, &cell),
          "tri for sheet missing");
      ref_cell_c2n(ref_grid_tri(ref_grid), 3, cell) = nodes[3];
      REIB(0, ML_getParamVerts(face[iface], vert, 3, &nvert), "Error Face Vert",
           { printf("iface %d\n", iface); });
      for (i = 0; i < 3; i++) {
        if (0 == ML_getParamVertInfo(vert[i], vref,
                                     REF_MESHLINK_MAX_STRING_SIZE, &vert_gref,
                                     &mid, uv)) {
          param[0] = uv[0];
          param[1] = uv[1];
          RSS(ref_geom_add(ref_geom, nodes[i], REF_GEOM_FACE, nodes[3], param),
              "face uv");
          RSS(ref_geom_find(ref_geom, nodes[i], REF_GEOM_FACE, nodes[3], &geom),
              "find");
          ref_geom_gref(ref_geom, geom) = (REF_INT)vert_gref;
        } else {
          param[0] = 0.0;
          param[1] = 0.0;
          RSS(ref_geom_add(ref_geom, nodes[i], REF_GEOM_FACE, nodes[3], param),
              "face uv");
          REF_WHERE("ML_getParamVertInfo face failed, no gref or param")
          printf("sheet gref %d xyz %f %f %f\n", nodes[3],
                 ref_node_xyz(ref_node, 0, nodes[i]),
                 ref_node_xyz(ref_node, 1, nodes[i]),
                 ref_node_xyz(ref_node, 2, nodes[i]));
        }
      }
    }
    ref_free(face);
  }
  ref_free(sheet);

  nstring = ML_getNumMeshStrings(mesh_model);
  printf("nstring %" MLINT_FORMAT "\n", nstring);
  ref_malloc(string, nstring, MeshTopoObj);
  REIS(0, ML_getMeshStrings(mesh_model, string, nstring, &mstring),
       "Error getting array of Mesh Strings");
  REIS(nstring, mstring, "string miscount");
  for (istring = 0; istring < nstring; istring++) {
    REIS(0, ML_getMeshTopoGref(string[istring], &string_gref),
         "Error getting Mesh String gref");
    nedge = ML_getNumStringMeshEdges(string[istring]);
    if (verbose)
      printf("nedge %" MLINT_FORMAT " for string %d with gref %" MLINT_FORMAT
             "\n",
             nedge, istring, string_gref);
    ref_malloc(edge, nedge, MeshTopoObj);
    REIS(0, ML_getStringMeshEdges(string[istring], edge, nedge, &medge),
         "Error getting array of Mesh String Mesh Edges");
    REIS(nedge, medge, "edge miscount");
    for (iedge = 0; iedge < nedge; iedge++) {
      REIS(0, ML_getEdgeInds(edge[iedge], e2n, &en), "Error Mesh Edge Ind");
      REIS(2, en, "edge ind miscount");
      RSS(ref_node_local(ref_node, e2n[0] - 1, &(nodes[0])), "g2l");
      RSS(ref_node_local(ref_node, e2n[1] - 1, &(nodes[1])), "g2l");
      nodes[2] = (REF_INT)string_gref;
      RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &cell),
          "add edg for string");
      REIS(0, ML_getParamVerts(edge[iedge], vert, 2, &nvert),
           "Error Face Vert");
      for (i = 0; i < 2; i++) {
        REIS(0,
             ML_getParamVertInfo(vert[i], vref, REF_MESHLINK_MAX_STRING_SIZE,
                                 &vert_gref, &mid, uv),
             "Error Face Vert");
        param[0] = uv[0];
        param[1] = uv[1];
        RSS(ref_geom_add(ref_geom, nodes[i], REF_GEOM_EDGE, nodes[2], param),
            "face uv");
        RSS(ref_geom_find(ref_geom, nodes[i], REF_GEOM_EDGE, nodes[2], &geom),
            "find");
        ref_geom_gref(ref_geom, geom) = (REF_INT)vert_gref;
      }
    }
    ref_free(edge);
  }
  ref_free(string);

  { /* mark cad nodes */
    REF_INT node;
    REF_INT edges[2];
    REF_INT n, id;
    each_ref_node_valid_node(ref_node, node) {
      RXS(ref_cell_id_list_around(ref_grid_edg(ref_grid), node, 2, &n, edges),
          REF_INCREASE_LIMIT, "count edgeids");
      if (n > 1) {
        id = (REF_INT)ref_node_global(ref_grid_node(ref_grid), node);
        RSS(ref_geom_add(ref_geom, node, REF_GEOM_NODE, id, param), "node");
      }
    }
  }

  /* shift negative face ids (not associated) positive */
  RSS(ref_dict_create(&ref_dict), "create");
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (0 > nodes[ref_cell_node_per(ref_cell)]) {
      RSS(ref_dict_store(ref_dict, nodes[ref_cell_node_per(ref_cell)],
                         REF_EMPTY),
          "store");
    }
  }
  RSS(ref_cell_id_range(ref_cell, ref_grid_mpi(ref_grid), &min_id, &max_id),
      "range");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (0 > nodes[ref_cell_node_per(ref_cell)]) {
      RSS(ref_dict_location(ref_dict, nodes[ref_cell_node_per(ref_cell)],
                            &location),
          "location");
      ref_cell_c2n(ref_cell, ref_cell_node_per(ref_cell), cell) =
          max_id + 1 + location;
    }
  }
  RSS(ref_dict_free(ref_dict), "free");

  if (REF_FALSE) RSS(ref_geom_constrain_all(ref_grid), "constrain");

  RSS(ref_geom_verify_topo(ref_grid), "geom topo");
  RSS(ref_geom_verify_param(ref_grid), "geom param");

#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_grid);
#endif
  return REF_SUCCESS;
}